

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>_>
::Intrusive_list_column
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>_>
           *this,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>_>
                 *column,Column_settings *colSettings)

{
  Field_operators *pFVar1;
  Entry_constructor *local_60;
  Field_operators *local_50;
  Delete_disposer local_40 [3];
  New_cloner local_28;
  Column_settings *local_20;
  Column_settings *colSettings_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>_>
  *column_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>_>
  *this_local;
  
  local_20 = colSettings;
  colSettings_local = (Column_settings *)column;
  column_local = this;
  Dummy_row_access::Dummy_row_access((Dummy_row_access *)this);
  if (local_20 == (Column_settings *)0x0) {
    local_50 = *(Field_operators **)&colSettings_local->operators;
  }
  else {
    local_50 = (Field_operators *)0x0;
  }
  this->operators_ = local_50;
  if (local_20 == (Column_settings *)0x0) {
    local_60 = (Entry_constructor *)
               (colSettings_local->operators).inverse_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  else {
    local_60 = &local_20->entryConstructor;
  }
  this->entryPool_ = local_60;
  boost::intrusive::
  list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
  ::list(&this->column_);
  if (local_20 != (Column_settings *)0x0) {
    this->operators_ = &local_20->operators;
  }
  pFVar1 = &colSettings_local->operators;
  New_cloner::New_cloner(&local_28,this->entryPool_);
  Delete_disposer::Delete_disposer(local_40,this);
  boost::intrusive::
  list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>::Matrix_column_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>>>>
  ::
  clone_from<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>::New_cloner,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>::Delete_disposer>
            ((list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>::Matrix_column_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>>>>
              *)&this->column_,
             (list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
              *)&(pFVar1->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_28,local_40[0]);
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(const Intrusive_list_column& column,
                                                                   Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor)),
      column_()
{
  static_assert(!Master_matrix::Option_list::has_row_access,
                "Simple copy constructor not available when row access option enabled. Please specify the new column "
                "index and the row container.");
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  column_.clone_from(column.column_, New_cloner(entryPool_), Delete_disposer(this));
}